

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

void Gia_ManEdgeFromArray(Gia_Man_t *p,Vec_Int_t *vArray)

{
  Vec_Int_t **p_00;
  int iVar1;
  int iNext;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  Vec_Int_t **p_01;
  int i;
  
  p_01 = &p->vEdge1;
  Vec_IntFreeP(p_01);
  p_00 = &p->vEdge2;
  Vec_IntFreeP(p_00);
  pVVar3 = Vec_IntStart(p->nObjs);
  p->vEdge1 = pVVar3;
  pVVar3 = Vec_IntStart(p->nObjs);
  p->vEdge2 = pVVar3;
  uVar4 = 0;
  i = 1;
  while( true ) {
    if (vArray->nSize <= i) {
      if (uVar4 != 0) {
        printf("Found %d violations during edge conversion.\n",(ulong)uVar4);
        return;
      }
      return;
    }
    iVar1 = Vec_IntEntry(vArray,i + -1);
    iNext = Vec_IntEntry(vArray,i);
    if (iNext <= iVar1) break;
    iVar2 = Gia_ObjEdgeAdd(iVar1,iNext,*p_01,*p_00);
    iVar1 = Gia_ObjEdgeAdd(iNext,iVar1,*p_01,*p_00);
    uVar4 = iVar1 + iVar2 + uVar4;
    i = i + 2;
  }
  __assert_fail("iObj1 < iObj2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x51,"void Gia_ManEdgeFromArray(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManEdgeFromArray( Gia_Man_t * p, Vec_Int_t * vArray )
{
    int i, iObj1, iObj2, Count = 0;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vArray, iObj1, iObj2, i )
    {
        assert( iObj1 < iObj2 );
        Count += Gia_ObjEdgeAdd( iObj1, iObj2, p->vEdge1, p->vEdge2 );
        Count += Gia_ObjEdgeAdd( iObj2, iObj1, p->vEdge1, p->vEdge2 );
    }
    if ( Count ) 
        printf( "Found %d violations during edge conversion.\n", Count );
}